

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::IsAllocationPageAligned
               (char *address,size_t pageCount,uint *nextIndex)

{
  ulong uVar1;
  
  uVar1 = pageCount * 0x1000 - 1 & (ulong)address;
  if (nextIndex != (uint *)0x0 && uVar1 != 0) {
    *nextIndex = (uint)((ulong)address % (pageCount * 0x1000) >> 0xc);
  }
  return uVar1 == 0;
}

Assistant:

bool
PageSegmentBase<T>::IsAllocationPageAligned(__in char* address, size_t pageCount, uint *nextIndex)
{
    // Require that allocations are aligned at a boundary
    // corresponding to the page count
    // REVIEW: This might actually lead to additional address space fragmentation
    // because of the leading guard pages feature in the page allocator
    // We can restrict the guard pages to be an even number to improve the chances
    // of having the first allocation be aligned but that reduces the effectiveness
    // of having a random number of guard pages
    uintptr_t mask = (pageCount * AutoSystemInfo::PageSize) - 1;
    if ((reinterpret_cast<uintptr_t>(address)& mask) == 0)
    {
        return true;
    }

    if (nextIndex != nullptr)
    {
        *nextIndex = (uint) ((reinterpret_cast<uintptr_t>(address) % (mask + 1)) / AutoSystemInfo::PageSize);
    }

    return false;
}